

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

int oonf_layer2_net_remove_ip(oonf_layer2_peer_address *ip,oonf_layer2_origin *origin)

{
  if (ip->origin != origin) {
    return -1;
  }
  oonf_class_event(&_l2net_addr_class,ip,OONF_OBJECT_REMOVED);
  avl_remove(&ip->l2net->local_peer_ips,&ip->_net_node);
  avl_remove(&_local_peer_ips_tree,&ip->_global_node);
  oonf_class_free(&_l2net_addr_class,ip);
  return 0;
}

Assistant:

int
oonf_layer2_net_remove_ip(struct oonf_layer2_peer_address *ip, const struct oonf_layer2_origin *origin) {
  if (ip->origin != origin) {
    return -1;
  }

  oonf_class_event(&_l2net_addr_class, ip, OONF_OBJECT_REMOVED);

  avl_remove(&ip->l2net->local_peer_ips, &ip->_net_node);
  avl_remove(&_local_peer_ips_tree, &ip->_global_node);
  oonf_class_free(&_l2net_addr_class, ip);
  return 0;
}